

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void __thiscall BasePort::BroadcastReadInfo::PrepareForRead(BroadcastReadInfo *this)

{
  uint local_14;
  uint bnum;
  BroadcastReadInfo *this_local;
  
  this->updateStartTime = 1.0;
  this->updateFinishTime = 0.0;
  this->updateOverflow = false;
  this->readOverflow = false;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    this->boardInfo[local_14].updated = false;
  }
  return;
}

Assistant:

void BasePort::BroadcastReadInfo::PrepareForRead()
{
    // Initialize update Start/Finish times (i.e., start/end of data update on FPGA Hub)
    // Units are seconds.
    updateStartTime = 1.0;
    updateFinishTime = 0.0;
    updateOverflow = false;
    readOverflow = false;
    for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++)
        boardInfo[bnum].updated = false;
}